

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O1

void makewt(int nw,int *ip,double *w)

{
  bool bVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  *ip = nw;
  ip[1] = 1;
  if (2 < nw) {
    uVar5 = (uint)nw >> 1;
    dVar9 = 0.7853981633974483 / (double)uVar5;
    dVar7 = cos((double)uVar5 * dVar9);
    *w = 1.0;
    w[1] = dVar7;
    if (uVar5 == 4) {
      dVar8 = cos(dVar9 + dVar9);
      w[2] = dVar8;
      dVar9 = sin(dVar9 + dVar9);
      w[3] = dVar9;
    }
    else if (9 < (uint)nw) {
      makeipt(nw,ip);
      dVar8 = cos(dVar9 + dVar9);
      w[2] = 0.5 / dVar8;
      dVar8 = cos(dVar9 * 6.0);
      w[3] = 0.5 / dVar8;
      uVar4 = 4;
      do {
        dVar8 = dVar9 * (double)(int)uVar4;
        dVar10 = cos(dVar8);
        w[uVar4] = dVar10;
        dVar8 = sin(dVar8);
        w[uVar4 + 1] = dVar8;
        dVar8 = (double)(int)uVar4 * dVar9 * 3.0;
        dVar10 = cos(dVar8);
        w[uVar4 + 2] = dVar10;
        dVar8 = sin(dVar8);
        w[uVar4 + 3] = -dVar8;
        uVar4 = uVar4 + 4;
      } while (uVar4 < uVar5);
    }
    if (5 < (uint)nw) {
      uVar4 = 0;
      do {
        uVar2 = (ulong)(uVar5 + (int)uVar4);
        uVar6 = uVar5 >> 1;
        w[uVar2] = 1.0;
        w[uVar2 + 1] = dVar7;
        if (uVar6 == 4) {
          dVar9 = (w + uVar4 + 4)[1];
          w[uVar2 + 2] = w[uVar4 + 4];
          (w + uVar2 + 2)[1] = dVar9;
        }
        else if (9 < uVar5) {
          dVar9 = w[uVar4 + 6];
          w[uVar2 + 2] = 0.5 / w[uVar4 + 4];
          w[uVar2 + 3] = 0.5 / dVar9;
          pdVar3 = w + uVar4 + 0xb;
          uVar4 = 4;
          do {
            dVar9 = pdVar3[-2];
            dVar8 = pdVar3[-1];
            dVar10 = *pdVar3;
            w[uVar2 + uVar4] = pdVar3[-3];
            (w + uVar2 + uVar4)[1] = dVar9;
            w[uVar2 + uVar4 + 2] = dVar8;
            (w + uVar2 + uVar4 + 2)[1] = dVar10;
            uVar4 = uVar4 + 4;
            pdVar3 = pdVar3 + 8;
          } while (uVar4 < uVar6);
        }
        bVar1 = 5 < uVar5;
        uVar4 = uVar2;
        uVar5 = uVar6;
      } while (bVar1);
    }
  }
  return;
}

Assistant:

void makewt(int nw, int *ip, double *w) {
  void makeipt(int nw, int *ip);
  int j, nwh, nw0, nw1;
  double delta, wn4r, wk1r, wk1i, wk3r, wk3i;

  ip[0] = nw;
  ip[1] = 1;
  if (nw > 2) {
    nwh = nw >> 1;
    delta = atan(1.0) / nwh;
    wn4r = cos(delta * nwh);
    w[0] = 1;
    w[1] = wn4r;
    if (nwh == 4) {
      w[2] = cos(delta * 2);
      w[3] = sin(delta * 2);
    } else if (nwh > 4) {
      makeipt(nw, ip);
      w[2] = 0.5 / cos(delta * 2);
      w[3] = 0.5 / cos(delta * 6);
      for (j = 4; j < nwh; j += 4) {
        w[j] = cos(delta * j);
        w[j + 1] = sin(delta * j);
        w[j + 2] = cos(3 * delta * j);
        w[j + 3] = -sin(3 * delta * j);
      }
    }
    nw0 = 0;
    while (nwh > 2) {
      nw1 = nw0 + nwh;
      nwh >>= 1;
      w[nw1] = 1;
      w[nw1 + 1] = wn4r;
      if (nwh == 4) {
        wk1r = w[nw0 + 4];
        wk1i = w[nw0 + 5];
        w[nw1 + 2] = wk1r;
        w[nw1 + 3] = wk1i;
      } else if (nwh > 4) {
        wk1r = w[nw0 + 4];
        wk3r = w[nw0 + 6];
        w[nw1 + 2] = 0.5 / wk1r;
        w[nw1 + 3] = 0.5 / wk3r;
        for (j = 4; j < nwh; j += 4) {
          wk1r = w[nw0 + 2 * j];
          wk1i = w[nw0 + 2 * j + 1];
          wk3r = w[nw0 + 2 * j + 2];
          wk3i = w[nw0 + 2 * j + 3];
          w[nw1 + j] = wk1r;
          w[nw1 + j + 1] = wk1i;
          w[nw1 + j + 2] = wk3r;
          w[nw1 + j + 3] = wk3i;
        }
      }
      nw0 = nw1;
    }
  }
}